

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind&,capnp::compiler::(anonymous_namespace)::ChangeKind>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind_&,_capnp::compiler::(anonymous_namespace)::ChangeKind>
          *params)

{
  char *pcVar1;
  size_t sVar2;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_a8;
  size_t sStack_a0;
  ArrayDisposer *pAStack_98;
  char **local_88;
  undefined8 uStack_80;
  String local_78;
  CappedArray<char,_14UL> local_58;
  CappedArray<char,_14UL> local_40;
  
  this->exception = (Exception *)0x0;
  Stringifier::operator*(&local_40,(Stringifier *)&_::STR,**(int **)file);
  Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(int *)(file + 8));
  concat<kj::CappedArray<char,14ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
            (&local_78,(_ *)&local_40,(CappedArray<char,_14UL> *)(file + 0x10),
             (StringPtr *)&local_58,(CappedArray<char,_14UL> *)condition);
  ppcVar3 = &local_a8;
  local_a8 = local_78.content.ptr;
  sStack_a0 = local_78.content.size_;
  pAStack_98 = local_78.content.disposer;
  uStack_80 = 1;
  uVar4 = 1;
  local_88 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
      );
  sVar2 = sStack_a0;
  pcVar1 = local_a8;
  if (local_a8 != (char *)0x0) {
    local_a8 = (char *)0x0;
    sStack_a0 = 0;
    (*(code *)**(undefined8 **)pAStack_98)(pAStack_98,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}